

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoop<short,short,duckdb::NotEquals,true,false,true,true>
                (short *ldata,short *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  short sVar1;
  short sVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  sel_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  if (count + 0x3f < 0x40) {
    iVar8 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      uVar12 = uVar13;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar15 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar15 = count;
        }
LAB_00edfe84:
        if (uVar13 < uVar15) {
          psVar5 = sel->sel_vector;
          sVar1 = *ldata;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          do {
            uVar12 = uVar13;
            if (psVar5 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar5[uVar13];
            }
            sVar2 = rdata[uVar13];
            psVar6[iVar8] = (sel_t)uVar12;
            iVar8 = iVar8 + (sVar1 != sVar2);
            psVar7[lVar11] = (sel_t)uVar12;
            lVar11 = lVar11 + (ulong)(sVar1 == sVar2);
            uVar13 = uVar13 + 1;
            uVar12 = uVar15;
          } while (uVar15 != uVar13);
        }
      }
      else {
        uVar4 = puVar3[uVar14];
        uVar15 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar15 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_00edfe84;
        if (uVar4 == 0) {
          uVar12 = uVar15;
          if (uVar13 < uVar15) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              uVar12 = uVar13;
              if (psVar5 != (sel_t *)0x0) {
                uVar12 = (ulong)psVar5[uVar13];
              }
              psVar6[lVar11] = (sel_t)uVar12;
              lVar11 = lVar11 + 1;
              uVar13 = uVar13 + 1;
              uVar12 = uVar15;
            } while (uVar15 != uVar13);
          }
        }
        else if (uVar13 < uVar15) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          uVar10 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar9 = (int)uVar13 + (int)uVar10;
            }
            else {
              sVar9 = psVar5[uVar13 + uVar10];
            }
            if ((uVar4 >> (uVar10 & 0x3f) & 1) == 0) {
              bVar16 = false;
            }
            else {
              bVar16 = *ldata != rdata[uVar13 + uVar10];
            }
            psVar6[iVar8] = sVar9;
            iVar8 = iVar8 + bVar16;
            psVar7[lVar11] = sVar9;
            lVar11 = lVar11 + (ulong)(bVar16 ^ 1);
            uVar10 = uVar10 + 1;
            uVar12 = uVar15;
          } while (uVar15 - uVar13 != uVar10);
        }
      }
      uVar13 = uVar12;
      uVar14 = uVar14 + 1;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}